

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_AB.c
# Opt level: O3

int main(int argc,char **argv)

{
  printf("  main_AB->");
  call_A();
  printf("  main_AB->");
  call_B();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  (void)argc;
  (void)argv;
  printf("  main_AB->");
  call_A();
  printf("  main_AB->");
  call_B();
  return 0;
}